

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  _Bool _Var1;
  time_t tVar2;
  altsvc *as_00;
  Curl_llist_node *pCVar3;
  altsvc *as;
  time_t now;
  Curl_llist_node *n;
  Curl_llist_node *e;
  int versions_local;
  altsvc **dstentry_local;
  int srcport_local;
  char *srchost_local;
  alpnid srcalpnid_local;
  altsvcinfo *asi_local;
  
  tVar2 = time((time_t *)0x0);
  n = Curl_llist_head(&asi->list);
  do {
    while( true ) {
      if (n == (Curl_llist_node *)0x0) {
        return false;
      }
      as_00 = (altsvc *)Curl_node_elem(n);
      pCVar3 = Curl_node_next(n);
      if (tVar2 <= as_00->expires) break;
      Curl_node_remove(n);
      altsvc_free(as_00);
      n = pCVar3;
    }
    n = pCVar3;
  } while (((((as_00->src).alpnid != srcalpnid) ||
            (_Var1 = hostcompare(srchost,(as_00->src).host), !_Var1)) ||
           ((uint)(as_00->src).port != srcport)) || ((versions & (as_00->dst).alpnid) == ALPN_none))
  ;
  *dstentry = as_00;
  return true;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = Curl_llist_head(&asi->list); e; e = n) {
    struct altsvc *as = Curl_node_elem(e);
    n = Curl_node_next(e);
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_node_remove(e);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       hostcompare(srchost, as->src.host) &&
       (as->src.port == srcport) &&
       (versions & (int)as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}